

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameconfigfile.cpp
# Opt level: O2

void __thiscall FGameConfigFile::ReadNetVars(FGameConfigFile *this)

{
  bool bVar1;
  
  strncpy(this->subsection,"NetServerInfo",this->sublen);
  bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,this->section,false);
  if (bVar1) {
    ReadCVars(this,0);
  }
  if (this->bModSetup == true) {
    mysnprintf(this->subsection,this->sublen,"NetServerInfo.Mod");
    bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,this->section,false);
    if (bVar1) {
      ReadCVars(this,0x6004);
      return;
    }
  }
  return;
}

Assistant:

void FGameConfigFile::ReadNetVars ()
{
	strncpy (subsection, "NetServerInfo", sublen);
	if (SetSection (section))
	{
		ReadCVars (0);
	}
	if (bModSetup)
	{
		mysnprintf(subsection, sublen, "NetServerInfo.Mod");
		if (SetSection(section))
		{
			ReadCVars(CVAR_MOD|CVAR_SERVERINFO|CVAR_IGNORE);
		}
	}
}